

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

Path * Pathie::Path::runtime_dir(void)

{
  char *pcVar1;
  ostream *poVar2;
  string *in_RDI;
  string nstr;
  allocator local_71;
  string local_70;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_70,"XDG_RUNTIME_DIR",&local_71);
  utf8_to_filename(&local_30,&local_70);
  std::__cxx11::string::_M_dispose();
  pcVar1 = getenv(local_30._M_dataplus._M_p);
  if (pcVar1 == (char *)0x0) {
    temp_dir();
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "(pathie XDG) WARNING: XDG_RUNTIME_DIR not defined in environment. Falling back to \'"
                            );
    std::__cxx11::string::string((string *)&local_70,in_RDI);
    poVar2 = std::operator<<(poVar2,(string *)&local_70);
    poVar2 = std::operator<<(poVar2,"\'.");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::_M_dispose();
  }
  else {
    std::__cxx11::string::string((string *)&local_70,pcVar1,&local_71);
    filename_to_utf8(&local_50,&local_70);
    Path((Path *)in_RDI,&local_50);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
  }
  std::__cxx11::string::_M_dispose();
  return (Path *)in_RDI;
}

Assistant:

Path Path::runtime_dir()
{
#if defined(_PATHIE_UNIX)
  std::string nstr = utf8_to_filename("XDG_RUNTIME_DIR"); // environment is encoded the same as paths
  char* env_value = getenv(nstr.c_str());
  if (env_value)
    return Path(filename_to_utf8(env_value));

  Path tmp = Path::temp_dir();
  std::cerr << "(pathie XDG) WARNING: XDG_RUNTIME_DIR not defined in environment. Falling back to '" << tmp.str() << "'." << std::endl;

  return tmp;
#elif defined(_WIN32)
  return temp_dir();
#else
#error Unsupported system.
#endif
}